

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void __thiscall
flatbuffers::cpp::CppGenerator::GenNativeTable(CppGenerator *this,StructDef *struct_def)

{
  bool bVar1;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *this_00;
  reference ppFVar2;
  allocator<char> local_191;
  string local_190;
  allocator<char> local_169;
  string local_168;
  FieldDef *local_148;
  FieldDef *field;
  const_iterator __end2;
  const_iterator __begin2;
  vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *__range2;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  string local_b0;
  allocator<char> local_89;
  string local_88;
  string local_58;
  undefined1 local_38 [8];
  string native_name;
  StructDef *struct_def_local;
  CppGenerator *this_local;
  
  native_name.field_2._8_8_ = struct_def;
  Name_abi_cxx11_(&local_58,this,&struct_def->super_Definition);
  NativeName((string *)local_38,&local_58,(StructDef *)native_name.field_2._8_8_,
             &(this->opts_).super_IDLOptions);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"STRUCT_NAME",&local_89);
  Name_abi_cxx11_(&local_b0,this,(Definition *)native_name.field_2._8_8_);
  CodeWriter::SetValue(&this->code_,&local_88,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"NATIVE_NAME",&local_d1);
  CodeWriter::SetValue(&this->code_,&local_d0,(string *)local_38);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {",
             &local_f9);
  CodeWriter::operator+=(&this->code_,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,"  typedef {{STRUCT_NAME}} TableType;",
             (allocator<char> *)((long)&__range2 + 7));
  CodeWriter::operator+=(&this->code_,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  GenFullyQualifiedNameGetter(this,(StructDef *)native_name.field_2._8_8_,(string *)local_38);
  this_00 = (vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
            (native_name.field_2._8_8_ + 0xf8);
  __end2 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     (this_00);
  field = (FieldDef *)
          std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                    (this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                                *)&field);
    if (!bVar1) break;
    ppFVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
              ::operator*(&__end2);
    local_148 = *ppFVar2;
    GenMember(this,local_148);
    __gnu_cxx::
    __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
    ::operator++(&__end2);
  }
  GenOperatorNewDelete(this,(StructDef *)native_name.field_2._8_8_);
  GenDefaultConstructor(this,(StructDef *)native_name.field_2._8_8_);
  GenCopyMoveCtorAndAssigOpDecls(this,(StructDef *)native_name.field_2._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"};",&local_169);
  CodeWriter::operator+=(&this->code_,&local_168);
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"",&local_191);
  CodeWriter::operator+=(&this->code_,&local_190);
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator(&local_191);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void GenNativeTable(const StructDef &struct_def) {
    const auto native_name = NativeName(Name(struct_def), &struct_def, opts_);
    code_.SetValue("STRUCT_NAME", Name(struct_def));
    code_.SetValue("NATIVE_NAME", native_name);

    // Generate a C++ object that can hold an unpacked version of this table.
    code_ += "struct {{NATIVE_NAME}} : public ::flatbuffers::NativeTable {";
    code_ += "  typedef {{STRUCT_NAME}} TableType;";
    GenFullyQualifiedNameGetter(struct_def, native_name);
    for (const auto field : struct_def.fields.vec) { GenMember(*field); }
    GenOperatorNewDelete(struct_def);
    GenDefaultConstructor(struct_def);
    GenCopyMoveCtorAndAssigOpDecls(struct_def);
    code_ += "};";
    code_ += "";
  }